

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O3

void VisualMatrixDX<float>(TPZFMatrix<float> *matrix,string *outfilename)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ofstream out;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  uVar1 = (matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  uVar2 = (matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  std::ofstream::ofstream((ostream *)&local_230,(outfilename->_M_dataplus)._M_p,_S_out|_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"# Graphical Visualization of Matrix.\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "# Positions as the indexes of the matrix, beginning by column.\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "# The number of elements in x direction correspond to the number of the columns of the matrix.\n"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "# The number of elements in y direction correspond to the number of the rows of the matrix.\n"
             ,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"object 1 class gridpositions counts ",0x24);
  iVar4 = (int)uVar2;
  poVar6 = (ostream *)std::ostream::operator<<(&local_230,iVar4 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  iVar5 = (int)uVar1;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"origin 0. 0.\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"delta 1. 0.\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"delta 0. 1.\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"attribute \"dep\" string \"positions\"",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"object 2 class gridconnections counts ",0x26);
  poVar6 = (ostream *)std::ostream::operator<<(&local_230,iVar4 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"attribute \"element type\" string \"quads\"",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"attribute \"ref\" string \"positions\"",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 5;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"object 3 class array type float rank 0 items ",0x2d);
  poVar6 = (ostream *)std::ostream::operator<<(&local_230,iVar5 * iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," data follows\n",0xe);
  if (0 < iVar4) {
    uVar7 = 0;
    do {
      if (0 < iVar5) {
        uVar8 = 0;
        do {
          lVar3 = (matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
          if ((lVar3 <= (long)uVar7) ||
             ((matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= (long)uVar8)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          poVar6 = std::ostream::_M_insert<double>((double)matrix->fElem[lVar3 * uVar8 + uVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          uVar8 = uVar8 + 1;
        } while ((uVar1 & 0x7fffffff) != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar2 & 0x7fffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"attribute \"dep\" string \"connections\" ",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"object 4 class field\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"component \"data\" value 3\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"component \"positions\" value 1\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"component \"connections\" value 2\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"attribute \"name\" string \"Matrix\"",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"end\n",4);
  std::ostream::flush();
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Data Explorer file ",0x13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(outfilename->_M_dataplus)._M_p,
                      outfilename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," was created with success!\n",0x1b);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _operator_delete__;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void VisualMatrixDX(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	const int nelx = matrix.Cols();
	const int nely = matrix.Rows();
	const int neltotal = nelx * nely;
	int i,j;
	ofstream out(outfilename.c_str(), ofstream::out | ofstream::binary); // binary prevents translation of "\n" under windows
	out << "# Graphical Visualization of Matrix.\n" ; 
	out << "# Positions as the indexes of the matrix, beginning by column.\n" ;
	out << "# The number of elements in x direction correspond to the number of the columns of the matrix.\n" ;
	out << "# The number of elements in y direction correspond to the number of the rows of the matrix.\n" ;
	
	out  << "object 1 class gridpositions counts " << nelx+1 << " " << nely +1 << "\n";
	out << "origin 0. 0.\n" ;
	out << "delta 1. 0.\n" ;
	out << "delta 0. 1.\n" ;
	out << "attribute \"dep\" string \"positions\"" << "\n" ;
	out << "\n" << std::flush;
	
	
	out << "object 2 class gridconnections counts " << nelx+1 << " " << nely +1 << "\n" ;
	
 	out << "attribute \"element type\" string \"quads\"" << "\n" ;
	out << "attribute \"ref\" string \"positions\"" << "\n" ;
	
	out.precision(5);
	out  << "object 3 class array type float rank 0 items " << neltotal << " data follows\n" ;
	for (i = 0; i < nelx; i++) {
		for(j=0; j< nely ; j++) out << matrix(i,j) << "\n" ;
	}
	out << "attribute \"dep\" string \"connections\" " << "\n" << std::flush;
	out << "\n" << std::flush;
	
	out << "object 4 class field\n" ;
	out << "component \"data\" value 3\n" ;
	out << "component \"positions\" value 1\n" ;
	out << "component \"connections\" value 2\n" ;
	out << "attribute \"name\" string \"Matrix\"" << "\n" << std::flush;
	
	out << "\n" ;
	out << "end\n" << std::flush;
	
	out.close();
	
	cout << "Data Explorer file " << outfilename << " was created with success!\n";
}